

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O2

bool __thiscall OpenMD::BaseAtomVisitor::isVisited(BaseAtomVisitor *this,Atom *atom)

{
  bool bVar1;
  shared_ptr<OpenMD::GenericData> data;
  allocator<char> local_49;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_38 [16];
  string local_28 [32];
  
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_28,"VISITED",&local_49);
  StuntDouble::getPropertyByName((StuntDouble *)local_38,(string *)atom);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_48,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::__cxx11::string::~string(local_28);
  bVar1 = local_48._M_ptr != (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return bVar1;
}

Assistant:

bool BaseAtomVisitor::isVisited(Atom* atom) {
    std::shared_ptr<GenericData> data;
    data = atom->getPropertyByName("VISITED");
    return data == nullptr ? false : true;
  }